

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O3

bool __thiscall
tinyusdz::crate::CrateReader::ReadDoubleVector
          (CrateReader *this,vector<double,_std::allocator<double>_> *d)

{
  ulong uVar1;
  pointer pdVar2;
  StreamReader *pSVar3;
  uint64_t uVar4;
  bool bVar5;
  ostream *poVar6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  size_t nbytes;
  size_t __n;
  uint64_t n;
  ostringstream ss_e;
  ulong local_1c8;
  long *local_1c0;
  long local_1b0 [2];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  bVar5 = StreamReader::read8(this->_sr,&local_1c8);
  if (bVar5) {
    if (local_1c8 == 0) {
      pdVar2 = (d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
          _M_finish == pdVar2) {
        return true;
      }
      (d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pdVar2;
      return true;
    }
    if ((this->_config).maxArrayElements < local_1c8) {
      ::std::__cxx11::ostringstream::ostringstream(local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"ReadDoubleVector",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"():",3);
      poVar6 = (ostream *)::std::ostream::operator<<(local_1a0,0x311);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      pcVar9 = "Too many array elements.";
      lVar8 = 0x18;
    }
    else {
      uVar1 = local_1c8 * 8;
      uVar7 = this->_memoryUsage + uVar1;
      this->_memoryUsage = uVar7;
      if (uVar7 <= (this->_config).maxMemoryBudget) {
        ::std::vector<double,_std::allocator<double>_>::resize(d,local_1c8);
        pSVar3 = this->_sr;
        uVar4 = pSVar3->idx_;
        __n = pSVar3->length_ - uVar4;
        if (uVar4 + uVar1 <= pSVar3->length_) {
          __n = uVar1;
        }
        if (__n - 1 < uVar1) {
          memcpy((d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start,pSVar3->binary_ + uVar4,__n);
          pSVar3->idx_ = pSVar3->idx_ + __n;
          return true;
        }
        goto LAB_001bbf38;
      }
      ::std::__cxx11::ostringstream::ostringstream(local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"ReadDoubleVector",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"():",3);
      poVar6 = (ostream *)::std::ostream::operator<<(local_1a0,0x314);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      pcVar9 = "Reached to max memory budget.";
      lVar8 = 0x1d;
    }
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar9,lVar8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n",1);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1c0);
    if (local_1c0 != local_1b0) {
      operator_delete(local_1c0,local_1b0[0] + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
    ::std::ios_base::~ios_base(local_130);
  }
  else {
LAB_001bbf38:
    ::std::__cxx11::string::append((char *)&this->_err);
  }
  return false;
}

Assistant:

bool CrateReader::ReadDoubleVector(std::vector<double> *d) {
  size_t length;

  uint64_t n;
  if (!_sr->read8(&n)) {
    _err += "Failed to read the number of array elements.\n";
    return false;
  }

  length = size_t(n);

  if (length == 0) {
    d->clear();
    return true;
  }

  if (length > _config.maxArrayElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many array elements.");
  }

  CHECK_MEMORY_USAGE(length * sizeof(double));

  d->resize(length);

  // TODO(syoyo): Zero-copy
  if (!_sr->read(sizeof(double) * length, sizeof(double) * length,
                 reinterpret_cast<uint8_t *>(d->data()))) {
    _err += "Failed to read double vector data.\n";
    return false;
  }

  return true;
}